

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesPerformanceFactorGetConfig(zes_perf_handle_t hPerf,double *pFactor)

{
  zes_pfnPerformanceFactorGetConfig_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnPerformanceFactorGetConfig_t pfnGetConfig;
  double *pFactor_local;
  zes_perf_handle_t hPerf_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->PerformanceFactor).pfnGetConfig;
    if (p_Var1 == (zes_pfnPerformanceFactorGetConfig_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hPerf_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hPerf_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hPerf_local._4_4_ = (*p_Var1)(hPerf,pFactor);
    }
  }
  else {
    hPerf_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hPerf_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesPerformanceFactorGetConfig(
    zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
    double* pFactor                                 ///< [in,out] Will contain the actual Performance Factor being used by the
                                                    ///< hardware (may not be the same as the requested Performance Factor).
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnPerformanceFactorGetConfig_t pfnGetConfig = [&result] {
        auto pfnGetConfig = ze_lib::context->zesDdiTable.load()->PerformanceFactor.pfnGetConfig;
        if( nullptr == pfnGetConfig ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetConfig;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetConfig( hPerf, pFactor );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetConfig = ze_lib::context->zesDdiTable.load()->PerformanceFactor.pfnGetConfig;
    if( nullptr == pfnGetConfig ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetConfig( hPerf, pFactor );
    #endif
}